

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_advance(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *pCVar5;
  int *piVar6;
  int temp_prac;
  int iLevel;
  int res;
  int level;
  CHAR_DATA *victim;
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffc9b8;
  undefined4 in_stack_ffffffffffffc9c0;
  undefined4 in_stack_ffffffffffffc9c4;
  int in_stack_ffffffffffffc9c8;
  int in_stack_ffffffffffffc9cc;
  int in_stack_ffffffffffffc9d0;
  undefined4 in_stack_ffffffffffffc9d4;
  char local_3618 [4304];
  char local_2418;
  undefined1 in_stack_ffffffffffffdc77;
  CHAR_DATA *in_stack_ffffffffffffdc78;
  char *in_stack_ffffffffffffedc0;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  char local_1218 [4616];
  char *local_10;
  
  local_10 = one_argument((char *)CONCAT44(in_stack_ffffffffffffc9c4,in_stack_ffffffffffffc9c0),
                          (char *)in_stack_ffffffffffffc9b8);
  local_10 = one_argument((char *)CONCAT44(in_stack_ffffffffffffc9c4,in_stack_ffffffffffffc9c0),
                          (char *)in_stack_ffffffffffffc9b8);
  if (((local_2418 == '\0') || (local_3618[0] == '\0')) ||
     (bVar1 = is_number((char *)in_stack_ffffffffffffc9b8), !bVar1)) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffc9d4,in_stack_ffffffffffffc9d0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
    return;
  }
  pCVar5 = get_char_world(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0);
  if (pCVar5 == (CHAR_DATA *)0x0) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffc9d4,in_stack_ffffffffffffc9d0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
    return;
  }
  bVar1 = is_npc(in_stack_ffffffffffffc9b8);
  if (!bVar1) {
    iVar2 = atoi(local_3618);
    if ((0 < iVar2) && (iVar2 < 0x3d)) {
      iVar4 = iVar2;
      iVar3 = get_trust(in_stack_ffffffffffffc9b8);
      if (iVar3 < iVar4) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc9d4,in_stack_ffffffffffffc9d0),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
        return;
      }
      if (pCVar5->level < iVar2) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc9d4,in_stack_ffffffffffffc9d0),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc9d4,in_stack_ffffffffffffc9d0),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
      }
      else {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc9d4,in_stack_ffffffffffffc9d0),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc9d4,in_stack_ffffffffffffc9d0),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
        in_stack_ffffffffffffc9d0 = (int)pCVar5->practice;
        pCVar5->level = 1;
        iVar4 = exp_per_level(in_stack_ffffffffffffc9b8);
        pCVar5->exp = iVar4;
        pCVar5->max_hit = 10;
        pCVar5->max_mana = 100;
        pCVar5->max_move = 100;
        pCVar5->pcdata->perm_hit = 10;
        pCVar5->pcdata->perm_mana = 100;
        pCVar5->pcdata->perm_move = 100;
        pCVar5->practice = 0;
        pCVar5->train = 0;
        pCVar5->hit = (int)pCVar5->max_hit;
        pCVar5->mana = pCVar5->max_mana;
        pCVar5->move = pCVar5->max_move;
        advance_level(in_stack_ffffffffffffdc78,(bool)in_stack_ffffffffffffdc77);
      }
      for (iVar4 = (int)pCVar5->level; iVar4 < iVar2; iVar4 = iVar4 + 1) {
        pCVar5->level = pCVar5->level + 1;
        advance_level(in_stack_ffffffffffffdc78,(bool)in_stack_ffffffffffffdc77);
      }
      sprintf(local_1218,"You are now level %d.\n\r",(ulong)(uint)(int)pCVar5->level);
      send_to_char((char *)CONCAT44(iVar4,in_stack_ffffffffffffc9d0),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
      if (0x33 < pCVar5->level) {
        CSQLInterface::Delete(&RS.SQL,"players WHERE name = \'%s\'",pCVar5->true_name);
      }
      iVar2 = exp_per_level(in_stack_ffffffffffffc9b8);
      piVar6 = std::max<int>((int *)&stack0xffffffffffffc9cc,(int *)&stack0xffffffffffffc9c8);
      pCVar5->exp = iVar2 * *piVar6;
      save_char_obj((CHAR_DATA *)arg1._24_8_);
      return;
    }
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffc9d4,in_stack_ffffffffffffc9d0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
    return;
  }
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffc9d4,in_stack_ffffffffffffc9d0),
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
  return;
}

Assistant:

void do_advance(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	int level, res = 0;
	int iLevel;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0' || !is_number(arg2))
	{
		send_to_char("Syntax: advance <char> <level>.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("That player is not here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	level = atoi(arg2);

	if (level < 1 || level > 60)
	{
		send_to_char("Level must be 1 to 60.\n\r", ch);
		return;
	}

	if (level > get_trust(ch))
	{
		send_to_char("Limited to your trust level.\n\r", ch);
		return;
	}

	/*
	 * Lower level:
	 *   Reset to level 1.
	 *   Then raise again.
	 *   Currently, an imp can lower another imp.
	 *   -- Swiftest
	 */
	if (level <= victim->level)
	{
		int temp_prac;

		send_to_char("Lowering a player's level!\n\r", ch);
		send_to_char("**** OOOOHHHHHHHHHH  NNNNOOOO ****\n\r", victim);
		temp_prac = victim->practice;
		victim->level = 1;
		victim->exp = exp_per_level(victim);
		victim->max_hit = 10;
		victim->max_mana = 100;
		victim->max_move = 100;
		victim->pcdata->perm_hit = 10;
		victim->pcdata->perm_mana = 100;
		victim->pcdata->perm_move = 100;
		victim->practice = 0;
		victim->train = 0;
		victim->hit = victim->max_hit;
		victim->mana = victim->max_mana;
		victim->move = victim->max_move;
		advance_level(victim, true);
	}
	else
	{
		send_to_char("Raising a player's level!\n\r", ch);
		send_to_char("**** OOOOHHHHHHHHHH  YYYYEEEESSS ****\n\r", victim);
	}

	for (iLevel = victim->level; iLevel < level; iLevel++)
	{
		victim->level += 1;
		advance_level(victim, false);
	}

	sprintf(buf, "You are now level %d.\n\r", victim->level);
	send_to_char(buf, victim);

	if (victim->level >= 52)
		res = RS.SQL.Delete("players WHERE name = '%s'", victim->true_name);

	victim->exp = exp_per_level(victim) * std::max(1, (int)victim->level);
	save_char_obj(victim);
}